

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O3

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar1 = *userData;
  lVar6 = (long)(iVar1 * 2) * 4 + *(long *)((long)userData + 8);
  iVar7 = *(int *)((long)userData + 4);
  uVar5 = (ulong)(uint)(iVar7 - iVar1);
  if (uVar5 < framesPerBuffer) {
    if (iVar7 == iVar1) {
      uVar5 = 0;
    }
    else {
      lVar3 = 0;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)outputBuffer + lVar8 * 8) = *(undefined4 *)(lVar6 + lVar8 * 8);
        *(undefined4 *)((long)outputBuffer + lVar8 * 8 + 4) = *(undefined4 *)(lVar6 + 4 + lVar8 * 8)
        ;
        lVar8 = lVar8 + 1;
        lVar3 = lVar3 + -8;
      } while (iVar7 - iVar1 != (uint)lVar8);
      outputBuffer = (void *)((long)outputBuffer - lVar3);
    }
    uVar4 = (uint)uVar5;
    iVar2 = 1;
    while (uVar5 < framesPerBuffer) {
      uVar4 = uVar4 + 1;
      *(undefined8 *)outputBuffer = 0;
      outputBuffer = (void *)((long)outputBuffer + 8);
      uVar5 = (ulong)uVar4;
    }
  }
  else {
    iVar2 = 0;
    uVar4 = 0;
    if (framesPerBuffer != 0) {
      lVar3 = 0;
      do {
        *(undefined4 *)((long)outputBuffer + lVar3 * 8) = *(undefined4 *)(lVar6 + lVar3 * 8);
        *(undefined4 *)((long)outputBuffer + lVar3 * 8 + 4) = *(undefined4 *)(lVar6 + 4 + lVar3 * 8)
        ;
        lVar3 = lVar3 + 1;
        uVar4 = (uint)framesPerBuffer;
      } while ((uint)lVar3 < (uint)framesPerBuffer);
    }
    iVar7 = iVar1 + uVar4;
  }
  *(int *)userData = iVar7;
  return iVar2;
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    SAMPLE *rptr = &data->recordedSamples[data->frameIndex * NUM_CHANNELS];
    SAMPLE *wptr = (SAMPLE*)outputBuffer;
    unsigned int i;
    int finished;
    unsigned int framesLeft = data->maxFrameIndex - data->frameIndex;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    if( framesLeft < framesPerBuffer )
    {
        /* final buffer... */
        for( i=0; i<framesLeft; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        for( ; i<framesPerBuffer; i++ )
        {
            *wptr++ = 0;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = 0;  /* right */
        }
        data->frameIndex += framesLeft;
        finished = paComplete;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *wptr++ = *rptr++;  /* left */
            if( NUM_CHANNELS == 2 ) *wptr++ = *rptr++;  /* right */
        }
        data->frameIndex += framesPerBuffer;
        finished = paContinue;
    }
    return finished;
}